

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void calculate_intermediate_result
               (int32_t *dgd,int width,int height,int dgd_stride,int bit_depth,int sgr_params_idx,
               int radius_idx,int pass,int32_t *A,int32_t *B)

{
  int iVar1;
  int r_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int in_EDX;
  int in_ESI;
  char in_R8B;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint32_t z;
  uint32_t s;
  uint32_t p;
  uint32_t b;
  uint32_t a;
  int n;
  int k;
  int j;
  int i;
  int step;
  int buf_stride;
  int height_ext;
  int width_ext;
  int r;
  sgr_params_type *params;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int local_44;
  int local_40;
  
  iVar1 = av1_sgr_params[in_R9D].r[in_stack_00000008];
  r_00 = (in_ESI + 9U & 0xfffffffc) + 0x10;
  iVar2 = 2;
  if (in_stack_00000010 == 0) {
    iVar2 = 1;
  }
  boxsum((int32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,r_00,
         (int)((ulong)_p >> 0x20),
         (int32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
         in_stack_ffffffffffffffb8);
  boxsum((int32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,r_00,
         (int)((ulong)_z >> 0x20),
         (int32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
         in_stack_ffffffffffffffb8);
  lVar8 = _z + (long)(r_00 * 3 + 3) * 4;
  lVar9 = _p + (long)(r_00 * 3 + 3) * 4;
  for (local_40 = -1; local_40 < in_EDX + 1; local_40 = iVar2 + local_40) {
    for (local_44 = -1; local_44 < in_ESI + 1; local_44 = local_44 + 1) {
      iVar3 = local_40 * r_00 + local_44;
      iVar4 = (iVar1 * 2 + 1) * (iVar1 * 2 + 1);
      iVar5 = *(int *)(lVar8 + (long)iVar3 * 4) + ((1 << ((in_R8B + -8) * '\x02' & 0x1fU)) >> 1) >>
              ((in_R8B + -8) * '\x02' & 0x1fU);
      iVar6 = *(int *)(lVar9 + (long)iVar3 * 4) + ((1 << (in_R8B - 8U & 0x1f)) >> 1) >>
              (in_R8B - 8U & 0x1f);
      if ((uint)(iVar5 * iVar4) < (uint)(iVar6 * iVar6)) {
        iVar5 = 0;
      }
      else {
        iVar5 = iVar5 * iVar4 - iVar6 * iVar6;
      }
      uVar7 = iVar5 * *(int *)((long)in_R9D * 0x10 + 0xbf7df8 + (long)in_stack_00000008 * 4) +
              0x80000U >> 0x14;
      if (0xfe < uVar7) {
        uVar7 = 0xff;
      }
      *(int32_t *)(lVar8 + (long)iVar3 * 4) = av1_x_by_xplus1[uVar7];
      *(uint *)(lVar9 + (long)iVar3 * 4) =
           (0x100 - *(int *)(lVar8 + (long)iVar3 * 4)) * *(int *)(lVar9 + (long)iVar3 * 4) *
           av1_one_by_x[iVar4 + -1] + 0x800U >> 0xc;
    }
  }
  return;
}

Assistant:

static void calculate_intermediate_result(int32_t *dgd, int width, int height,
                                          int dgd_stride, int bit_depth,
                                          int sgr_params_idx, int radius_idx,
                                          int pass, int32_t *A, int32_t *B) {
  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  const int r = params->r[radius_idx];
  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;
  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes, for consistency
  // with the SIMD version of this function.
  int buf_stride = ((width_ext + 3) & ~3) + 16;
  const int step = pass == 0 ? 1 : 2;
  int i, j;

  assert(r <= MAX_RADIUS && "Need MAX_RADIUS >= r");
  assert(r <= SGRPROJ_BORDER_VERT - 1 && r <= SGRPROJ_BORDER_HORZ - 1 &&
         "Need SGRPROJ_BORDER_* >= r+1");

  boxsum(dgd - dgd_stride * SGRPROJ_BORDER_VERT - SGRPROJ_BORDER_HORZ,
         width_ext, height_ext, dgd_stride, r, 0, B, buf_stride);
  boxsum(dgd - dgd_stride * SGRPROJ_BORDER_VERT - SGRPROJ_BORDER_HORZ,
         width_ext, height_ext, dgd_stride, r, 1, A, buf_stride);
  A += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  B += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  // Calculate the eventual A[] and B[] arrays. Include a 1-pixel border - ie,
  // for a 64x64 processing unit, we calculate 66x66 pixels of A[] and B[].
  for (i = -1; i < height + 1; i += step) {
    for (j = -1; j < width + 1; ++j) {
      const int k = i * buf_stride + j;
      const int n = (2 * r + 1) * (2 * r + 1);

      // a < 2^16 * n < 2^22 regardless of bit depth
      uint32_t a = ROUND_POWER_OF_TWO(A[k], 2 * (bit_depth - 8));
      // b < 2^8 * n < 2^14 regardless of bit depth
      uint32_t b = ROUND_POWER_OF_TWO(B[k], bit_depth - 8);

      // Each term in calculating p = a * n - b * b is < 2^16 * n^2 < 2^28,
      // and p itself satisfies p < 2^14 * n^2 < 2^26.
      // This bound on p is due to:
      // https://en.wikipedia.org/wiki/Popoviciu's_inequality_on_variances
      //
      // Note: Sometimes, in high bit depth, we can end up with a*n < b*b.
      // This is an artefact of rounding, and can only happen if all pixels
      // are (almost) identical, so in this case we saturate to p=0.
      uint32_t p = (a * n < b * b) ? 0 : a * n - b * b;

      const uint32_t s = params->s[radius_idx];

      // p * s < (2^14 * n^2) * round(2^20 / n^2 eps) < 2^34 / eps < 2^32
      // as long as eps >= 4. So p * s fits into a uint32_t, and z < 2^12
      // (this holds even after accounting for the rounding in s)
      const uint32_t z = ROUND_POWER_OF_TWO(p * s, SGRPROJ_MTABLE_BITS);

      // Note: We have to be quite careful about the value of A[k].
      // This is used as a blend factor between individual pixel values and the
      // local mean. So it logically has a range of [0, 256], including both
      // endpoints.
      //
      // This is a pain for hardware, as we'd like something which can be stored
      // in exactly 8 bits.
      // Further, in the calculation of B[k] below, if z == 0 and r == 2,
      // then A[k] "should be" 0. But then we can end up setting B[k] to a value
      // slightly above 2^(8 + bit depth), due to rounding in the value of
      // av1_one_by_x[25-1].
      //
      // Thus we saturate so that, when z == 0, A[k] is set to 1 instead of 0.
      // This fixes the above issues (256 - A[k] fits in a uint8, and we can't
      // overflow), without significantly affecting the final result: z == 0
      // implies that the image is essentially "flat", so the local mean and
      // individual pixel values are very similar.
      //
      // Note that saturating on the other side, ie. requring A[k] <= 255,
      // would be a bad idea, as that corresponds to the case where the image
      // is very variable, when we want to preserve the local pixel value as
      // much as possible.
      A[k] = av1_x_by_xplus1[AOMMIN(z, 255)];  // in range [1, 256]

      // SGRPROJ_SGR - A[k] < 2^8 (from above), B[k] < 2^(bit_depth) * n,
      // av1_one_by_x[n - 1] = round(2^12 / n)
      // => the product here is < 2^(20 + bit_depth) <= 2^32,
      // and B[k] is set to a value < 2^(8 + bit depth)
      // This holds even with the rounding in av1_one_by_x and in the overall
      // result, as long as SGRPROJ_SGR - A[k] is strictly less than 2^8.
      B[k] = (int32_t)ROUND_POWER_OF_TWO((uint32_t)(SGRPROJ_SGR - A[k]) *
                                             (uint32_t)B[k] *
                                             (uint32_t)av1_one_by_x[n - 1],
                                         SGRPROJ_RECIP_BITS);
    }
  }
}